

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

ZSTD_DDict *
ZSTD_createDDict_advanced
          (void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  ZSTD_DDict *ddict;
  size_t sVar1;
  ZSTD_customMem cMem;
  
  if (((customMem.customFree == (ZSTD_freeFunction)0x0) ==
       (customMem.customAlloc == (ZSTD_allocFunction)0x0)) &&
     (ddict = (ZSTD_DDict *)ZSTD_malloc(0x7060,customMem), ddict != (ZSTD_DDict *)0x0)) {
    (ddict->cMem).opaque = customMem.opaque;
    (ddict->cMem).customAlloc = customMem.customAlloc;
    (ddict->cMem).customFree = customMem.customFree;
    sVar1 = ZSTD_initDDict_internal(ddict,dict,dictSize,dictLoadMethod,dictContentType);
    if (sVar1 < 0xffffffffffffff89) {
      return ddict;
    }
    customMem_00 = ddict->cMem;
    ZSTD_free(ddict->dictBuffer,ddict->cMem);
    ZSTD_free(ddict,customMem_00);
  }
  return (ZSTD_DDict *)0x0;
}

Assistant:

ZSTD_DDict* ZSTD_createDDict_advanced(const void* dict, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_customMem customMem)
{
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    {   ZSTD_DDict* const ddict = (ZSTD_DDict*) ZSTD_malloc(sizeof(ZSTD_DDict), customMem);
        if (!ddict) return NULL;
        ddict->cMem = customMem;

        if (ZSTD_isError( ZSTD_initDDict_internal(ddict, dict, dictSize, dictLoadMethod, dictContentType) )) {
            ZSTD_freeDDict(ddict);
            return NULL;
        }

        return ddict;
    }
}